

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_reader.hpp
# Opt level: O2

MultiFileReaderBindData * __thiscall
duckdb::MultiFileReader::BindReader<duckdb::ParquetMultiFileInfo,duckdb::ParquetOptions>
          (MultiFileReaderBindData *__return_storage_ptr__,MultiFileReader *this,
          ClientContext *context,vector<duckdb::LogicalType,_true> *return_types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names,MultiFileList *files,MultiFileBindData *result,ParquetOptions *options,
          MultiFileOptions *file_options)

{
  pointer pMVar1;
  BaseFileReader *pBVar2;
  pointer __args;
  shared_ptr<duckdb::BaseFileReader,_true> reader;
  undefined1 local_88 [88];
  
  if (file_options->union_by_name == true) {
    BindUnionReader<duckdb::ParquetMultiFileInfo,duckdb::ParquetOptions>
              (__return_storage_ptr__,this,context,return_types,names,files,result,options,
               file_options);
  }
  else {
    reader.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    reader.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    MultiFileList::GetFirstFile((OpenFileInfo *)(local_88 + 0x28),files);
    ParquetMultiFileInfo::CreateReader
              ((ClientContext *)local_88,(OpenFileInfo *)context,(ParquetOptions *)(local_88 + 0x28)
               ,(MultiFileOptions *)options);
    shared_ptr<duckdb::BaseFileReader,_true>::operator=
              (&reader,(shared_ptr<duckdb::BaseFileReader,_true> *)local_88);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
    OpenFileInfo::~OpenFileInfo((OpenFileInfo *)(local_88 + 0x28));
    pBVar2 = shared_ptr<duckdb::BaseFileReader,_true>::operator->(&reader);
    pMVar1 = (pBVar2->columns).
             super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
             .
             super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__args = (pBVar2->columns).
                  super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                  .
                  super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                  ._M_impl.super__Vector_impl_data._M_start; __args != pMVar1; __args = __args + 1)
    {
      ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
      emplace_back<duckdb::LogicalType_const&>
                ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
                 &__args->type);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
                 &__args->name);
    }
    local_88._16_8_ =
         reader.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_88._24_8_ =
         reader.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    reader.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    reader.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    shared_ptr<duckdb::BaseFileReader,_true>::operator=
              (&result->initial_reader,(shared_ptr<duckdb::BaseFileReader,_true> *)(local_88 + 0x10)
              );
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 0x18));
    (__return_storage_ptr__->filename_idx).index = 0xffffffffffffffff;
    (__return_storage_ptr__->hive_partitioning_indexes).
    super_vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>.
    super__Vector_base<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->hive_partitioning_indexes).
    super_vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>.
    super__Vector_base<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->hive_partitioning_indexes).
    super_vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>.
    super__Vector_base<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->schema).
    super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
    .
    super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->schema).
    super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
    .
    super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->schema).
    super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
    .
    super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __return_storage_ptr__->mapping = BY_NAME;
    (*this->_vptr_MultiFileReader[8])
              (this,file_options,files,return_types,names,__return_storage_ptr__);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&reader.internal.
                super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return __return_storage_ptr__;
}

Assistant:

MultiFileReaderBindData BindReader(ClientContext &context, vector<LogicalType> &return_types, vector<string> &names,
	                                   MultiFileList &files, MultiFileBindData &result, OPTIONS_TYPE &options,
	                                   MultiFileOptions &file_options) {
		if (file_options.union_by_name) {
			return BindUnionReader<OP>(context, return_types, names, files, result, options, file_options);
		} else {
			shared_ptr<BaseFileReader> reader;
			reader = OP::CreateReader(context, files.GetFirstFile(), options, file_options);
			auto &columns = reader->GetColumns();
			for (auto &column : columns) {
				return_types.emplace_back(column.type);
				names.emplace_back(column.name);
			}
			result.Initialize(std::move(reader));
			MultiFileReaderBindData bind_data;
			BindOptions(file_options, files, return_types, names, bind_data);
			return bind_data;
		}
	}